

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket_linux.cpp
# Opt level: O1

int sk_server_start_loop(int port,void *userdata)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint __val;
  uint __len;
  string __str;
  char *local_50 [2];
  char local_40 [16];
  
  __val = -port;
  if (0 < port) {
    __val = port;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_001061bb;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_001061bb;
      }
      if (uVar3 < 10000) goto LAB_001061bb;
      uVar4 = uVar4 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_001061bb:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(port >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + ((uint)port >> 0x1f),__len,__val);
  iVar2 = ep_server_start_loop(local_50[0],userdata);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return iVar2;
}

Assistant:

int sk_server_start_loop(int port, void* userdata) {
    return ep_server_start_loop(std::to_string(port).c_str(), userdata);
}